

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_prov_mac.c
# Opt level: O2

int id_tc26_cipher_gostr3412_2015_kuznyechik_ctracpkm_omac_get_params(OSSL_PARAM *params)

{
  int iVar1;
  
  iVar1 = mac_get_params(&id_tc26_cipher_gostr3412_2015_kuznyechik_ctracpkm_omac_desc,params);
  return iVar1;
}

Assistant:

static int mac_get_params(const GOST_DESC * descriptor, OSSL_PARAM params[])
{
    OSSL_PARAM *p = NULL;

    if (((p = OSSL_PARAM_locate(params, "size")) != NULL
         && !OSSL_PARAM_set_size_t(p, descriptor->initial_mac_size))
        || ((p = OSSL_PARAM_locate(params, "keylen")) != NULL
            && !OSSL_PARAM_set_size_t(p, 32)))
        return 0;
    return 1;
}